

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QList<bool_(*)(void_**)>_>::reallocateAndGrow
          (QArrayDataPointer<QList<bool_(*)(void_**)>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QList<bool_(*)(void_**)>_> *old)

{
  long lVar1;
  bool bVar2;
  QList<bool_(*)(void_**)> *pQVar3;
  QGenericArrayOps<QList<bool_(*)(void_**)>_> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *in_stack_ffffffffffffff78;
  QGenericArrayOps<QList<bool_(*)(void_**)>_> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QList<bool_(*)(void_**)>_> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QList<bool_(*)(void_**)>_> *)&DAT_aaaaaaaaaaaaaaaa,
                 (qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QList<bool_(*)(void_**)>_> *)&stack0xffffffffffffffe0),
       pQVar3 == (QList<bool_(*)(void_**)> *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00234656;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QList<bool_(*)(void_**)>_> *)
                  operator->((QArrayDataPointer<QList<bool_(*)(void_**)>_> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QList<bool_(*)(void_**)>_> *)0x234567);
        begin((QArrayDataPointer<QList<bool_(*)(void_**)>_> *)0x234576);
        QtPrivate::QGenericArrayOps<QList<bool_(*)(void_**)>_>::copyAppend
                  (this_00,(QList<bool_(*)(void_**)> *)in_stack_ffffffffffffff78,
                   (QList<bool_(*)(void_**)> *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<QList<bool_(*)(void_**)>_> *)
             operator->((QArrayDataPointer<QList<bool_(*)(void_**)>_> *)&stack0xffffffffffffffe0);
        pQVar3 = begin((QArrayDataPointer<QList<bool_(*)(void_**)>_> *)0x2345af);
        begin((QArrayDataPointer<QList<bool_(*)(void_**)>_> *)0x2345be);
        QtPrivate::QGenericArrayOps<QList<bool_(*)(void_**)>_>::moveAppend
                  (in_stack_ffffffffffffff80,pQVar3,
                   (QList<bool_(*)(void_**)> *)in_stack_ffffffffffffff70);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<QList<bool_(*)(void_**)>_> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<QList<bool_(*)(void_**)>_> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QList<bool_(*)(void_**)>_>::reallocate
              ((QMovableArrayOps<QList<bool_(*)(void_**)>_> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00234656:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }